

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMA_CC_Unmarshal(TPMA_CC *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal((UINT32 *)target,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0xa1;
    if ((*(ushort *)&target->field_0x2 & 0xc03f) == 0) {
      TVar1 = *(ushort *)&target->field_0x2 & 0xc03f;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMA_CC_Unmarshal(TPMA_CC *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_CC_Unmarshal((TPM_CC *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(*((UINT32 *)target) & (UINT32)0xc03f0000)
        return TPM_RC_RESERVED_BITS;
    return TPM_RC_SUCCESS;
}